

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

double pugi::impl::anon_unknown_0::convert_string_to_number(char_t *string)

{
  byte bVar1;
  char_t *pcVar2;
  char_t *pcVar3;
  byte *pbVar4;
  ulong uVar5;
  double dVar6;
  
  pcVar3 = string + -2;
  do {
    pcVar2 = pcVar3;
    pcVar3 = pcVar2 + 1;
  } while (((anonymous_namespace)::chartype_table[(byte)pcVar2[2]] & 8) != 0);
  uVar5 = (ulong)(pcVar2[2] == 0x2d);
  bVar1 = pcVar2[uVar5 + 2];
  if (((ulong)bVar1 != 0) &&
     ((0xfffffffffffffff5 < (ulong)bVar1 - 0x3a ||
      ((bVar1 == 0x2e && (0xfffffffffffffff5 < (ulong)(byte)pcVar2[uVar5 + 3] - 0x3a)))))) {
    do {
      pbVar4 = (byte *)(pcVar3 + uVar5 + 1);
      pcVar3 = pcVar3 + 1;
    } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
    if (*pbVar4 == 0x2e) {
      do {
        pbVar4 = (byte *)(pcVar3 + uVar5 + 1);
        pcVar3 = pcVar3 + 1;
      } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
    }
    pbVar4 = (byte *)(pcVar3 + uVar5);
    do {
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
    if (bVar1 == 0) {
      dVar6 = strtod(string,(char **)0x0);
      return dVar6;
    }
  }
  return NAN;
}

Assistant:

PUGI__FN bool check_string_to_number_format(const char_t* string)
	{
		// parse leading whitespace
		while (PUGI__IS_CHARTYPE(*string, ct_space)) ++string;

		// parse sign
		if (*string == '-') ++string;

		if (!*string) return false;

		// if there is no integer part, there should be a decimal part with at least one digit
		if (!PUGI__IS_CHARTYPEX(string[0], ctx_digit) && (string[0] != '.' || !PUGI__IS_CHARTYPEX(string[1], ctx_digit))) return false;

		// parse integer part
		while (PUGI__IS_CHARTYPEX(*string, ctx_digit)) ++string;

		// parse decimal part
		if (*string == '.')
		{
			++string;

			while (PUGI__IS_CHARTYPEX(*string, ctx_digit)) ++string;
		}

		// parse trailing whitespace
		while (PUGI__IS_CHARTYPE(*string, ct_space)) ++string;

		return *string == 0;
	}